

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O2

void __thiscall
capnp::JsonCodec::addFieldHandlerImpl(JsonCodec *this,Field field,Type type,HandlerBase *handler)

{
  HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*> *table;
  Impl *pIVar1;
  bool bVar2;
  Fault local_88;
  long local_80;
  Fault f;
  anon_union_8_2_eba6ea51_for_Type_5 aStack_70;
  Type type_local;
  
  type_local.field_4 = type.field_4;
  type_local._0_8_ = type._0_8_;
  _f = StructSchema::Field::getType(&field);
  bVar2 = Type::operator==(&type_local,(Type *)&f);
  if (!bVar2) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[60]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
               ,0x36b,FAILED,"type == field.getType()",
               "\"handler type did not match field type for addFieldHandler()\"",
               (char (*) [60])"handler type did not match field type for addFieldHandler()");
    kj::_::Debug::Fault::fatal(&f);
  }
  pIVar1 = (this->impl).ptr;
  table = &pIVar1->fieldHandlers;
  aStack_70 = (anon_union_8_2_eba6ea51_for_Type_5)field._8_8_;
  f.exception = (Exception *)field.parent.super_Schema.raw;
  kj::
  Table<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Entry,_kj::HashIndex<kj::HashMap<capnp::StructSchema::Field,_capnp::JsonCodec::HandlerBase_*>::Callbacks>_>
  ::Impl<0UL,_false>::insert
            ((Impl<0UL,_false> *)&local_88,&table->table,
             ((long)(pIVar1->fieldHandlers).table.rows.builder.pos -
             (long)(pIVar1->fieldHandlers).table.rows.builder.ptr) / 0x48,(Entry *)&f,0xffffffff);
  if (local_88.exception._0_1_ == (Impl<0UL,_false>)0x1) {
    if ((table->table).rows.builder.ptr[local_80].value != handler) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[49]>
                (&local_88,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/compat/json.c++"
                 ,0x36d,FAILED,"existing == replacement",
                 "\"field already has a different registered handler\"",
                 (char (*) [49])"field already has a different registered handler");
      kj::_::Debug::Fault::fatal(&local_88);
    }
  }
  else {
    kj::Vector<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry>::
    add<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry>
              ((Vector<kj::HashMap<capnp::StructSchema::Field,capnp::JsonCodec::HandlerBase*>::Entry>
                *)table,(Entry *)&f);
  }
  return;
}

Assistant:

void JsonCodec::addFieldHandlerImpl(StructSchema::Field field, Type type, HandlerBase& handler) {
  KJ_REQUIRE(type == field.getType(),
      "handler type did not match field type for addFieldHandler()");
  impl->fieldHandlers.upsert(field, &handler, [](HandlerBase*& existing, HandlerBase* replacement) {
    KJ_REQUIRE(existing == replacement, "field already has a different registered handler");
  });
}